

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_speakAsyncU16(OpenJTalk *oj,char16_t *text)

{
  char *__ptr;
  OpenJTalk *in_RSI;
  long in_RDI;
  char *temp;
  char16_t *in_stack_ffffffffffffffe8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    openjtalk_stop((OpenJTalk *)0x19a1ff);
    synthesisU16(in_RSI,in_stack_ffffffffffffffe8);
    __ptr = u16tou8((char16_t *)0x19a218);
    free(__ptr);
    speakasync((OpenJTalk *)0x19a22f);
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakAsyncU16(OpenJTalk *oj, const char16_t *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);
	synthesisU16(oj, text);
	char *temp = u16tou8(text);
	free(temp);
	speakasync(oj);
}